

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::objectivec::OneofNameCapitalized_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,OneofDescriptor *descriptor)

{
  char cVar1;
  char *pcVar2;
  char cVar3;
  
  OneofName_abi_cxx11_(__return_storage_ptr__,this,descriptor);
  if (__return_storage_ptr__->_M_string_length != 0) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = *pcVar2;
    cVar3 = cVar1 + -0x20;
    if (0x19 < (byte)(cVar1 + 0x9fU)) {
      cVar3 = cVar1;
    }
    *pcVar2 = cVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

string OneofNameCapitalized(const OneofDescriptor* descriptor) {
  // Use the common handling and then up-case the first letter.
  string result = OneofName(descriptor);
  if (result.length() > 0) {
    result[0] = ascii_toupper(result[0]);
  }
  return result;
}